

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void build_ycc_rgb_table(j_decompress_ptr cinfo)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDI;
  JLONG x;
  int i;
  my_cconvert_ptr_conflict cconvert;
  undefined8 local_20;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_RDI + 0x268);
  uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x400);
  *(undefined8 *)(lVar1 + 0x10) = uVar2;
  uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x400);
  *(undefined8 *)(lVar1 + 0x18) = uVar2;
  uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x800);
  *(undefined8 *)(lVar1 + 0x20) = uVar2;
  uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x800);
  *(undefined8 *)(lVar1 + 0x28) = uVar2;
  local_20 = -0x80;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    *(int *)(*(long *)(lVar1 + 0x10) + (long)local_14 * 4) =
         (int)((ulong)(local_20 * 0x166e9 + 0x8000) >> 0x10);
    *(int *)(*(long *)(lVar1 + 0x18) + (long)local_14 * 4) =
         (int)((ulong)(local_20 * 0x1c5a2 + 0x8000) >> 0x10);
    *(long *)(*(long *)(lVar1 + 0x20) + (long)local_14 * 8) = local_20 * -0xb6d2;
    *(long *)(*(long *)(lVar1 + 0x28) + (long)local_14 * 8) = local_20 * -0x581a + 0x8000;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

LOCAL(void)
build_ycc_rgb_table(j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr)cinfo->cconvert;
  int i;
  JLONG x;
  SHIFT_TEMPS

  cconvert->Cr_r_tab = (int *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (MAXJSAMPLE + 1) * sizeof(int));
  cconvert->Cb_b_tab = (int *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (MAXJSAMPLE + 1) * sizeof(int));
  cconvert->Cr_g_tab = (JLONG *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (MAXJSAMPLE + 1) * sizeof(JLONG));
  cconvert->Cb_g_tab = (JLONG *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (MAXJSAMPLE + 1) * sizeof(JLONG));

  for (i = 0, x = -CENTERJSAMPLE; i <= MAXJSAMPLE; i++, x++) {
    /* i is the actual input pixel value, in the range 0..MAXJSAMPLE */
    /* The Cb or Cr value we are thinking of is x = i - CENTERJSAMPLE */
    /* Cr=>R value is nearest int to 1.40200 * x */
    cconvert->Cr_r_tab[i] = (int)
                    RIGHT_SHIFT(FIX(1.40200) * x + ONE_HALF, SCALEBITS);
    /* Cb=>B value is nearest int to 1.77200 * x */
    cconvert->Cb_b_tab[i] = (int)
                    RIGHT_SHIFT(FIX(1.77200) * x + ONE_HALF, SCALEBITS);
    /* Cr=>G value is scaled-up -0.71414 * x */
    cconvert->Cr_g_tab[i] = (-FIX(0.71414)) * x;
    /* Cb=>G value is scaled-up -0.34414 * x */
    /* We also add in ONE_HALF so that need not do it in inner loop */
    cconvert->Cb_g_tab[i] = (-FIX(0.34414)) * x + ONE_HALF;
  }
}